

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t set_conversion_failed_error(archive_read *a,archive_string_conv *sconv,char *name)

{
  wchar_t wVar1;
  int *piVar2;
  char *pcVar3;
  
  piVar2 = __errno_location();
  if (*piVar2 == 0xc) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory for %s",name);
    wVar1 = L'\xffffffe2';
  }
  else {
    pcVar3 = archive_string_conversion_charset_name(sconv);
    archive_set_error(&a->archive,0x54,"%s can\'t be converted from %s to current locale.",name,
                      pcVar3);
    wVar1 = L'\xffffffec';
  }
  return wVar1;
}

Assistant:

static int
set_conversion_failed_error(struct archive_read *a,
    struct archive_string_conv *sconv, const char *name)
{
	if (errno == ENOMEM) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for %s", name);
		return (ARCHIVE_FATAL);
	}
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "%s can't be converted from %s to current locale.",
	    name, archive_string_conversion_charset_name(sconv));
	return (ARCHIVE_WARN);
}